

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O3

Sym_Man_t * Sym_ManStart(Abc_Ntk_t *pNtk,int fVerbose)

{
  ulong uVar1;
  Sym_Man_t *pSVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Extra_BitMat_t *pEVar9;
  uint *puVar10;
  Vec_Vec_t *pVVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  long lVar22;
  
  pSVar2 = (Sym_Man_t *)calloc(1,0xf8);
  pSVar2->pNtk = pNtk;
  ppvVar5 = (void **)0x0;
  pVVar3 = Abc_NtkDfs(pNtk,0);
  pSVar2->vNodes = pVVar3;
  uVar17 = pNtk->vCis->nSize;
  pSVar2->nInputs = uVar17;
  uVar15 = pNtk->vCos->nSize;
  uVar18 = (ulong)uVar15;
  lVar22 = (long)(int)uVar15;
  iVar20 = (((int)uVar17 >> 5) + 1) - (uint)((uVar17 & 0x1f) == 0);
  pSVar2->nOutputs = uVar15;
  pSVar2->nSimWords = iVar20;
  pVVar3 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,iVar20,0);
  pSVar2->vSim = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar15 - 1) {
    uVar13 = uVar15;
  }
  pVVar3->nCap = uVar13;
  lVar4 = (long)(int)uVar13;
  if (uVar13 != 0) {
    ppvVar5 = (void **)malloc(lVar4 * 8);
  }
  pVVar3->pArray = ppvVar5;
  pVVar3->nSize = uVar15;
  __s = (void **)0x0;
  memset(ppvVar5,0,lVar22 * 8);
  pSVar2->vMatrSymms = pVVar3;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = uVar13;
  if (uVar13 != 0) {
    __s = (void **)malloc(lVar4 * 8);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = uVar15;
  memset(__s,0,lVar22 * 8);
  pSVar2->vMatrNonSymms = pVVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar15 - 1) {
    uVar14 = uVar15;
  }
  pVVar7->nCap = uVar14;
  if (uVar14 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar15;
    pSVar2->vPairsTotal = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 0;
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar15;
    pSVar2->vPairsSym = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 0;
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = uVar15;
  }
  else {
    sVar21 = (long)(int)uVar14 << 2;
    piVar8 = (int *)malloc(sVar21);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = uVar15;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0,lVar22 * 4);
    }
    pSVar2->vPairsTotal = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = uVar14;
    piVar8 = (int *)malloc(sVar21);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = uVar15;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0,lVar22 * 4);
    }
    pSVar2->vPairsSym = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = uVar14;
    piVar8 = (int *)malloc(sVar21);
    pVVar7->pArray = piVar8;
    pVVar7->nSize = uVar15;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0,lVar22 << 2);
    }
  }
  pSVar2->vPairsNonSym = pVVar7;
  if (0 < (int)uVar15) {
    uVar16 = 0;
    do {
      pEVar9 = Extra_BitMatrixStart(uVar17);
      pVVar3->pArray[uVar16] = pEVar9;
      pEVar9 = Extra_BitMatrixStart(uVar17);
      pVVar6->pArray[uVar16] = pEVar9;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  sVar21 = (long)iVar20 << 2;
  puVar10 = (uint *)malloc(sVar21);
  pSVar2->uPatRand = puVar10;
  puVar10 = (uint *)malloc(sVar21);
  pSVar2->uPatCol = puVar10;
  puVar10 = (uint *)malloc(sVar21);
  pSVar2->uPatRow = puVar10;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  piVar8 = (int *)calloc(1,400);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = 100;
  pSVar2->vVarsU = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  piVar8 = (int *)calloc(1,400);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = 100;
  pSVar2->vVarsV = pVVar7;
  pVVar3 = Sim_ComputeFunSupp(pNtk,fVerbose);
  pSVar2->vSuppFun = pVVar3;
  pVVar11 = (Vec_Vec_t *)malloc(0x10);
  pVVar11->nCap = uVar13;
  if (uVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc(lVar4 << 3);
  }
  pVVar11->pArray = ppvVar5;
  if ((int)uVar15 < 1) {
    pVVar11->nSize = uVar15;
    pSVar2->vSupports = pVVar11;
  }
  else {
    uVar16 = 0;
    do {
      pvVar12 = calloc(1,0x10);
      ppvVar5[uVar16] = pvVar12;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
    pVVar11->nSize = uVar15;
    pSVar2->vSupports = pVVar11;
    if (0 < (int)uVar15) {
      uVar16 = 0;
      do {
        uVar1 = uVar16 + 1;
        if (0 < (int)uVar17) {
          iVar20 = (int)uVar1;
          uVar18 = 0;
          do {
            uVar15 = (uint)uVar18;
            if ((*(uint *)((long)pVVar3->pArray[uVar16] + (uVar18 >> 5) * 4) >> (uVar15 & 0x1f) & 1)
                != 0) {
              uVar18 = (ulong)pVVar11->nSize;
              if ((long)uVar18 <= (long)uVar16) {
                if ((long)pVVar11->nCap <= (long)uVar16) {
                  if (pVVar11->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(uVar1 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar11->pArray,uVar1 * 8);
                    uVar18 = (ulong)pVVar11->nSize;
                  }
                  pVVar11->pArray = ppvVar5;
                  pVVar11->nCap = iVar20;
                }
                if ((long)uVar18 <= (long)uVar16) {
                  do {
                    uVar19 = uVar18 + 1;
                    pvVar12 = calloc(1,0x10);
                    pVVar11->pArray[uVar18] = pvVar12;
                    uVar18 = uVar19;
                  } while (uVar1 != (uVar19 & 0xffffffff));
                }
                pVVar11->nSize = iVar20;
                uVar18 = (long)iVar20;
              }
              if ((long)uVar18 <= (long)uVar16) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                              ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
              }
              puVar10 = (uint *)pVVar11->pArray[uVar16];
              uVar17 = puVar10[1];
              if (uVar17 == *puVar10) {
                if ((int)uVar17 < 0x10) {
                  if (*(void **)(puVar10 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x40);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar10 + 2),0x40);
                  }
                  *(void **)(puVar10 + 2) = pvVar12;
                  if (pvVar12 == (void *)0x0) {
LAB_008d1138:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  *puVar10 = 0x10;
                }
                else {
                  if (*(void **)(puVar10 + 2) == (void *)0x0) {
                    pvVar12 = malloc((ulong)uVar17 * 8);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(puVar10 + 2),(ulong)uVar17 * 8);
                  }
                  *(void **)(puVar10 + 2) = pvVar12;
                  if (pvVar12 == (void *)0x0) goto LAB_008d1138;
                  *puVar10 = uVar17 * 2;
                }
              }
              else {
                pvVar12 = *(void **)(puVar10 + 2);
              }
              uVar17 = puVar10[1];
              puVar10[1] = uVar17 + 1;
              *(uint *)((long)pvVar12 + (long)(int)uVar17 * 4) = uVar15;
              uVar17 = pSVar2->nInputs;
            }
            uVar18 = (ulong)(uVar15 + 1);
          } while ((int)(uVar15 + 1) < (int)uVar17);
          uVar18 = (ulong)(uint)pSVar2->nOutputs;
        }
        uVar16 = uVar1;
      } while ((long)uVar1 < (long)(int)uVar18);
    }
  }
  return pSVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the simulation manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sym_Man_t * Sym_ManStart( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    int i, v; 
    // start the manager
    p = ABC_ALLOC( Sym_Man_t, 1 );
    memset( p, 0, sizeof(Sym_Man_t) );
    p->pNtk = pNtk;
    p->vNodes     = Abc_NtkDfs( pNtk, 0 );
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimWords  = SIM_NUM_WORDS(p->nInputs);
    p->vSim       = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    // symmetry info for each output
    p->vMatrSymms    = Vec_PtrStart( p->nOutputs );
    p->vMatrNonSymms = Vec_PtrStart( p->nOutputs );
    p->vPairsTotal   = Vec_IntStart( p->nOutputs );
    p->vPairsSym     = Vec_IntStart( p->nOutputs );
    p->vPairsNonSym  = Vec_IntStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        p->vMatrSymms->pArray[i]    = Extra_BitMatrixStart( p->nInputs );
        p->vMatrNonSymms->pArray[i] = Extra_BitMatrixStart( p->nInputs );
    }
    // temporary patterns
    p->uPatRand = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatCol  = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatRow  = ABC_ALLOC( unsigned, p->nSimWords );
    p->vVarsU   = Vec_IntStart( 100 );
    p->vVarsV   = Vec_IntStart( 100 );
    // compute supports
    p->vSuppFun  = Sim_ComputeFunSupp( pNtk, fVerbose );
    p->vSupports = Vec_VecStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
        for ( v = 0; v < p->nInputs; v++ )
            if ( Sim_SuppFunHasVar( p->vSuppFun, i, v ) )
                Vec_VecPushInt( p->vSupports, i, v );
    return p;
}